

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

double __thiscall
TxConfirmStats::EstimateMedianVal
          (TxConfirmStats *this,int confTarget,double sufficientTxVal,double successBreakPoint,
          uint nBlockHeight,EstimationResult *result)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer pdVar10;
  pointer piVar11;
  double dVar12;
  string_view source_file;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  Level LVar16;
  double *pdVar17;
  Logger *pLVar18;
  Level LVar19;
  double *pdVar20;
  ulong uVar21;
  double *pdVar22;
  int iVar23;
  uint uVar24;
  double *pdVar25;
  uint confct;
  uint uVar26;
  Level LVar27;
  Level LVar28;
  int iVar29;
  Level LVar30;
  long in_FS_OFFSET;
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  string_view str;
  string_view logging_function;
  double *in_stack_fffffffffffffe38;
  Level local_1b0;
  double local_160;
  float failed_within_target_perc;
  float passed_within_target_perc;
  double median;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double adStack_f0 [2];
  int confTarget_local;
  string local_78;
  string log_msg;
  
  pdVar22 = (double *)(ulong)(uint)confTarget;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->scale;
  pdVar4 = (this->buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar5 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_118 = -1.0;
  dStack_110 = -1.0;
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_f8 = 0.0;
  adStack_f0[0] = 0.0;
  local_148 = -1.0;
  dStack_140 = -1.0;
  local_138 = 0.0;
  dStack_130 = 0.0;
  local_128 = 0.0;
  dStack_120 = 0.0;
  iVar23 = ((confTarget + uVar2) - 1) / uVar2 - 1;
  pvVar7 = (this->confAvg).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar8 = (this->failAvg).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar9 = (this->confAvg).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar10 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar1 = this->decay;
  dVar43 = 0.0;
  dVar33 = 0.0;
  dVar34 = 0.0;
  dVar12 = 0.0;
  dVar41 = 0.0;
  dVar39 = 0.0;
  dVar35 = 0.0;
  dVar37 = 0.0;
  bVar15 = true;
  piVar11 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar14 = true;
  bVar13 = 0;
  iVar29 = 0;
  LVar28 = (int)((ulong)((long)(this->buckets->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4) >> 3) -
           Debug;
  LVar16 = LVar28;
  LVar30 = LVar28;
  local_1b0 = LVar28;
  for (LVar27 = LVar28; -1 < (int)LVar27; LVar27 = LVar27 - Debug) {
    if (bVar15) {
      LVar30 = LVar27;
    }
    pdVar22 = (double *)(ulong)LVar27;
    dVar41 = dVar41 + pdVar10[(long)pdVar22];
    uVar24 = nBlockHeight - confTarget;
    for (uVar26 = confTarget; uVar26 < (int)(((long)pvVar9 - (long)pvVar7) / 0x18) * uVar2;
        uVar26 = uVar26 + 1) {
      iVar29 = iVar29 + *(int *)(*(long *)&pvVar6[(ulong)uVar24 %
                                                  (((long)pvVar5 - (long)pvVar6) / 0x18 &
                                                  0xffffffffU)].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data + (long)pdVar22 * 4);
      uVar24 = uVar24 - 1;
    }
    if (bVar15) {
      bVar15 = false;
    }
    dVar36 = dVar35 + *(double *)
                       (*(long *)&pvVar7[iVar23].super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data + (long)pdVar22 * 8);
    dVar38 = dVar37 + pdVar10[(long)pdVar22];
    dVar40 = dVar39 + *(double *)
                       (*(long *)&pvVar8[iVar23].super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data + (long)pdVar22 * 8);
    iVar29 = iVar29 + piVar11[(long)pdVar22];
    dVar35 = dVar36;
    dVar37 = dVar38;
    dVar39 = dVar40;
    if (sufficientTxVal / (1.0 - dVar1) <= dVar41) {
      dVar42 = (double)iVar29;
      if (successBreakPoint <= dVar36 / (dVar38 + dVar40 + dVar42)) {
        local_128 = 0.0;
        dStack_120 = 0.0;
        local_138 = 0.0;
        dStack_130 = 0.0;
        local_148 = -1.0;
        dVar35 = 0.0;
        dVar37 = 0.0;
        iVar29 = 0;
        dVar39 = 0.0;
        bVar14 = true;
        dStack_140 = -1.0;
        pdVar17 = &local_108;
        pdVar22 = &local_f8;
        pdVar25 = adStack_f0;
        bVar15 = true;
        bVar13 = 1;
        pdVar20 = &dStack_100;
        dVar33 = dVar40;
        dVar34 = dVar42;
        dVar43 = dVar36;
        LVar28 = LVar27;
        dVar12 = dVar38;
        local_1b0 = LVar30;
      }
      else {
        dVar41 = 0.0;
        if (!bVar14) goto LAB_0024dbcf;
        LVar19 = LVar27;
        LVar16 = LVar30;
        if (LVar27 < LVar30) {
          LVar19 = LVar30;
          LVar16 = LVar27;
        }
        if (LVar16 != Trace) {
          dVar41 = pdVar4[LVar16 - Debug];
        }
        dStack_140 = pdVar4[LVar19];
        bVar14 = false;
        pdVar17 = &local_138;
        pdVar22 = &local_128;
        pdVar25 = &dStack_120;
        pdVar20 = &dStack_130;
        local_148 = dVar41;
      }
      *pdVar17 = dVar36;
      *pdVar20 = dVar38;
      *pdVar22 = dVar42;
      *pdVar25 = dVar40;
      dVar41 = 0.0;
    }
LAB_0024dbcf:
    LVar16 = LVar27;
  }
  median = -1.0;
  LVar27 = LVar28;
  if (LVar28 < local_1b0) {
    LVar27 = local_1b0;
    local_1b0 = LVar28;
  }
  dVar1 = 0.0;
  for (LVar28 = local_1b0; pdVar17 = (double *)(ulong)LVar28, LVar28 <= LVar27;
      LVar28 = LVar28 + Debug) {
    dVar1 = dVar1 + pdVar10[(long)pdVar17];
    pdVar22 = pdVar17;
  }
  uVar21 = CONCAT71((int7)((ulong)pdVar22 >> 8),dVar1 != 0.0);
  LVar28 = (Level)uVar21;
  if ((bool)(bVar13 & dVar1 != 0.0)) {
    dVar1 = dVar1 * 0.5;
    LVar19 = local_1b0;
    while( true ) {
      LVar28 = (Level)uVar21;
      uVar21 = (ulong)LVar19;
      if (LVar27 < LVar19) break;
      dVar41 = pdVar10[uVar21];
      if (dVar1 <= dVar41) {
        median = (this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar21] / dVar41;
        LVar28 = LVar19;
        break;
      }
      dVar1 = dVar1 - dVar41;
      LVar19 = LVar19 + Debug;
    }
    if (local_1b0 == Trace) {
      uVar31 = 0;
      uVar32 = 0;
    }
    else {
      uVar31 = SUB84(pdVar4[local_1b0 - Debug],0);
      uVar32 = (undefined4)((ulong)pdVar4[local_1b0 - Debug] >> 0x20);
    }
    local_118 = (double)CONCAT44(uVar32,uVar31);
    dStack_110 = pdVar4[LVar27];
  }
  if ((bVar14) && (!bVar15)) {
    LVar27 = LVar16;
    if (LVar16 < LVar30) {
      LVar27 = LVar30;
      LVar30 = LVar16;
    }
    if (LVar30 == Trace) {
      uVar31 = 0;
      uVar32 = 0;
    }
    else {
      uVar31 = SUB84(pdVar4[LVar30 - Debug],0);
      uVar32 = (undefined4)((ulong)pdVar4[LVar30 - Debug] >> 0x20);
    }
    local_148 = (double)CONCAT44(uVar32,uVar31);
    dStack_140 = pdVar4[LVar27];
    local_128 = (double)iVar29;
    local_138 = dVar35;
    dStack_130 = dVar37;
    dStack_120 = dVar39;
  }
  passed_within_target_perc = 0.0;
  failed_within_target_perc = 0.0;
  dVar33 = dVar12 + dVar34 + dVar33;
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    passed_within_target_perc = (float)((dVar43 * 100.0) / dVar33);
  }
  dVar1 = dStack_130 + local_128 + dStack_120;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    failed_within_target_perc = (float)((local_138 * 100.0) / dVar1);
  }
  confTarget_local = confTarget;
  bVar15 = ::LogAcceptCategory((ulong)(nBlockHeight - confTarget),LVar28);
  if (bVar15) {
    local_160 = successBreakPoint * 100.0;
    pLVar18 = LogInstance();
    bVar15 = BCLog::Logger::Enabled(pLVar18);
    if (bVar15) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::
      format<int,double,double,double,double,double,float,double,double,double,double,double,double,float,double,double,double,double>
                (&local_78,
                 (tinyformat *)
                 "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n"
                 ,(char *)&confTarget_local,(int *)&local_160,&this->decay,&median,&local_118,
                 &dStack_110,(double *)&passed_within_target_perc,(float *)&local_108,&dStack_100,
                 &local_f8,adStack_f0,&local_148,&dStack_140,(double *)&failed_within_target_perc,
                 (float *)&local_138,&dStack_130,&local_128,&dStack_120,in_stack_fffffffffffffe38);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pLVar18 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x58;
      local_78._M_string_length = 0x6bcbfd;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "EstimateMedianVal";
      logging_function._M_len = 0x11;
      BCLog::Logger::LogPrintStr(pLVar18,str,logging_function,source_file,0x18b,ESTIMATEFEE,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  if (result != (EstimationResult *)0x0) {
    (result->pass).inMempool = local_f8;
    (result->pass).leftMempool = adStack_f0[0];
    (result->pass).withinTarget = local_108;
    (result->pass).totalConfirmed = dStack_100;
    (result->pass).start = local_118;
    (result->pass).end = dStack_110;
    (result->fail).start = local_148;
    (result->fail).end = dStack_140;
    (result->fail).withinTarget = local_138;
    (result->fail).totalConfirmed = dStack_130;
    (result->fail).inMempool = local_128;
    (result->fail).leftMempool = dStack_120;
    result->decay = this->decay;
    result->scale = this->scale;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return median;
  }
  __stack_chk_fail();
}

Assistant:

double TxConfirmStats::EstimateMedianVal(int confTarget, double sufficientTxVal,
                                         double successBreakPoint, unsigned int nBlockHeight,
                                         EstimationResult *result) const
{
    // Counters for a bucket (or range of buckets)
    double nConf = 0; // Number of tx's confirmed within the confTarget
    double totalNum = 0; // Total number of tx's that were ever confirmed
    int extraNum = 0;  // Number of tx's still in mempool for confTarget or longer
    double failNum = 0; // Number of tx's that were never confirmed but removed from the mempool after confTarget
    const int periodTarget = (confTarget + scale - 1) / scale;
    const int maxbucketindex = buckets.size() - 1;

    // We'll combine buckets until we have enough samples.
    // The near and far variables will define the range we've combined
    // The best variables are the last range we saw which still had a high
    // enough confirmation rate to count as success.
    // The cur variables are the current range we're counting.
    unsigned int curNearBucket = maxbucketindex;
    unsigned int bestNearBucket = maxbucketindex;
    unsigned int curFarBucket = maxbucketindex;
    unsigned int bestFarBucket = maxbucketindex;

    // We'll always group buckets into sets that meet sufficientTxVal --
    // this ensures that we're using consistent groups between different
    // confirmation targets.
    double partialNum = 0;

    bool foundAnswer = false;
    unsigned int bins = unconfTxs.size();
    bool newBucketRange = true;
    bool passing = true;
    EstimatorBucket passBucket;
    EstimatorBucket failBucket;

    // Start counting from highest feerate transactions
    for (int bucket = maxbucketindex; bucket >= 0; --bucket) {
        if (newBucketRange) {
            curNearBucket = bucket;
            newBucketRange = false;
        }
        curFarBucket = bucket;
        nConf += confAvg[periodTarget - 1][bucket];
        partialNum += txCtAvg[bucket];
        totalNum += txCtAvg[bucket];
        failNum += failAvg[periodTarget - 1][bucket];
        for (unsigned int confct = confTarget; confct < GetMaxConfirms(); confct++)
            extraNum += unconfTxs[(nBlockHeight - confct) % bins][bucket];
        extraNum += oldUnconfTxs[bucket];
        // If we have enough transaction data points in this range of buckets,
        // we can test for success
        // (Only count the confirmed data points, so that each confirmation count
        // will be looking at the same amount of data and same bucket breaks)

        if (partialNum < sufficientTxVal / (1 - decay)) {
            // the buckets we've added in this round aren't sufficient
            // so keep adding
            continue;
        } else {
            partialNum = 0; // reset for the next range we'll add

            double curPct = nConf / (totalNum + failNum + extraNum);

            // Check to see if we are no longer getting confirmed at the success rate
            if (curPct < successBreakPoint) {
                if (passing == true) {
                    // First time we hit a failure record the failed bucket
                    unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
                    unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
                    failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
                    failBucket.end = buckets[failMaxBucket];
                    failBucket.withinTarget = nConf;
                    failBucket.totalConfirmed = totalNum;
                    failBucket.inMempool = extraNum;
                    failBucket.leftMempool = failNum;
                    passing = false;
                }
                continue;
            }
            // Otherwise update the cumulative stats, and the bucket variables
            // and reset the counters
            else {
                failBucket = EstimatorBucket(); // Reset any failed bucket, currently passing
                foundAnswer = true;
                passing = true;
                passBucket.withinTarget = nConf;
                nConf = 0;
                passBucket.totalConfirmed = totalNum;
                totalNum = 0;
                passBucket.inMempool = extraNum;
                passBucket.leftMempool = failNum;
                failNum = 0;
                extraNum = 0;
                bestNearBucket = curNearBucket;
                bestFarBucket = curFarBucket;
                newBucketRange = true;
            }
        }
    }

    double median = -1;
    double txSum = 0;

    // Calculate the "average" feerate of the best bucket range that met success conditions
    // Find the bucket with the median transaction and then report the average feerate from that bucket
    // This is a compromise between finding the median which we can't since we don't save all tx's
    // and reporting the average which is less accurate
    unsigned int minBucket = std::min(bestNearBucket, bestFarBucket);
    unsigned int maxBucket = std::max(bestNearBucket, bestFarBucket);
    for (unsigned int j = minBucket; j <= maxBucket; j++) {
        txSum += txCtAvg[j];
    }
    if (foundAnswer && txSum != 0) {
        txSum = txSum / 2;
        for (unsigned int j = minBucket; j <= maxBucket; j++) {
            if (txCtAvg[j] < txSum)
                txSum -= txCtAvg[j];
            else { // we're in the right bucket
                median = m_feerate_avg[j] / txCtAvg[j];
                break;
            }
        }

        passBucket.start = minBucket ? buckets[minBucket-1] : 0;
        passBucket.end = buckets[maxBucket];
    }

    // If we were passing until we reached last few buckets with insufficient data, then report those as failed
    if (passing && !newBucketRange) {
        unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
        unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
        failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
        failBucket.end = buckets[failMaxBucket];
        failBucket.withinTarget = nConf;
        failBucket.totalConfirmed = totalNum;
        failBucket.inMempool = extraNum;
        failBucket.leftMempool = failNum;
    }

    float passed_within_target_perc = 0.0;
    float failed_within_target_perc = 0.0;
    if ((passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool)) {
        passed_within_target_perc = 100 * passBucket.withinTarget / (passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool);
    }
    if ((failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool)) {
        failed_within_target_perc = 100 * failBucket.withinTarget / (failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool);
    }

    LogDebug(BCLog::ESTIMATEFEE, "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n",
             confTarget, 100.0 * successBreakPoint, decay,
             median, passBucket.start, passBucket.end,
             passed_within_target_perc,
             passBucket.withinTarget, passBucket.totalConfirmed, passBucket.inMempool, passBucket.leftMempool,
             failBucket.start, failBucket.end,
             failed_within_target_perc,
             failBucket.withinTarget, failBucket.totalConfirmed, failBucket.inMempool, failBucket.leftMempool);


    if (result) {
        result->pass = passBucket;
        result->fail = failBucket;
        result->decay = decay;
        result->scale = scale;
    }
    return median;
}